

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

uint64_t fio_rand64(void)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t seed;
  uint64_t seed_00;
  ulong uVar4;
  long *in_FS_OFFSET;
  rusage rusage;
  rusage local_a0;
  
  lVar1 = in_FS_OFFSET[-0x52];
  *(short *)(in_FS_OFFSET + -0x52) = (short)lVar1 + 1;
  if ((short)lVar1 == 0) {
    getrusage(RUSAGE_SELF,&local_a0);
    lVar1 = *in_FS_OFFSET;
    uVar2 = fio_risky_hash(&local_a0,in_FS_OFFSET[-0x54],seed);
    in_FS_OFFSET[-0x54] = uVar2;
    uVar2 = fio_risky_hash(&local_a0,uVar2,seed_00);
    in_FS_OFFSET[-0x53] = uVar2;
  }
  else {
    lVar1 = *in_FS_OFFSET;
  }
  uVar4 = in_FS_OFFSET[-0x54];
  uVar4 = (uVar4 << 0x21 | uVar4 >> 0x1f) * 0x37701261ed6c16c7 + uVar4;
  in_FS_OFFSET[-0x54] = uVar4;
  uVar3 = *(ulong *)(lVar1 + -0x298);
  uVar3 = (uVar3 << 0x21 | uVar3 >> 0x1f) * 0x764dbbb75f3b3e0d + uVar3;
  *(ulong *)(lVar1 + -0x298) = uVar3;
  return (uVar3 * 0x20000000 | uVar3 >> 0x23) + (uVar4 * 0x80000000 | uVar4 >> 0x21);
}

Assistant:

uint64_t fio_rand64(void) {
  /* modeled after xoroshiro128+, by David Blackman and Sebastiano Vigna */
  static __thread uint64_t s[2]; /* random state */
  static __thread uint16_t c;    /* seed counter */
  const uint64_t P[] = {0x37701261ED6C16C7ULL, 0x764DBBB75F3B3E0DULL};
  if (c++ == 0) {
    /* re-seed state every 65,536 requests */
#ifdef RUSAGE_SELF
    struct rusage rusage;
    getrusage(RUSAGE_SELF, &rusage);
    s[0] = fio_risky_hash(&rusage, sizeof(rusage), s[0]);
    s[1] = fio_risky_hash(&rusage, sizeof(rusage), s[0]);
#else
    struct timespec clk;
    clock_gettime(CLOCK_REALTIME, &clk);
    s[0] = fio_risky_hash(&clk, sizeof(clk), s[0]);
    s[1] = fio_risky_hash(&clk, sizeof(clk), s[0]);
#endif
  }
  s[0] += fio_lrot64(s[0], 33) * P[0];
  s[1] += fio_lrot64(s[1], 33) * P[1];
  return fio_lrot64(s[0], 31) + fio_lrot64(s[1], 29);
}